

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QBoxLayout::setDirection(QBoxLayout *this,Direction direction)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  int h;
  QSpacerItem *this_00;
  int extraout_var;
  Policy hPolicy;
  int i;
  ulong uVar4;
  Policy local_34;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if (*(Direction *)(lVar1 + 0x11c) != direction) {
    if (direction < Down != *(Direction *)(lVar1 + 0x11c) < Down) {
      for (uVar4 = 0; uVar4 < *(ulong *)(lVar1 + 0xc0); uVar4 = uVar4 + 1) {
        puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0xb8) + uVar4 * 8);
        if ((*(char *)((long)puVar2 + 0xc) == '\x01') &&
           (this_00 = (QSpacerItem *)(**(code **)(*(long *)*puVar2 + 0x78))(),
           this_00 != (QSpacerItem *)0x0)) {
          iVar3 = (*(this_00->super_QLayoutItem)._vptr_QLayoutItem[5])(this_00);
          if (iVar3 == 0) {
            h = (*(this_00->super_QLayoutItem)._vptr_QLayoutItem[2])(this_00);
            hPolicy = (Policy)(direction >= Down);
            local_34 = (Policy)(direction < Down);
            iVar3 = extraout_var;
          }
          else {
            iVar3 = 0;
            h = 0;
            if (direction < Down) {
              hPolicy = Expanding;
              local_34 = Minimum;
            }
            else {
              hPolicy = Minimum;
              local_34 = Expanding;
            }
          }
          QSpacerItem::changeSize(this_00,iVar3,h,hPolicy,local_34);
        }
      }
    }
    *(Direction *)(lVar1 + 0x11c) = direction;
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }